

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::values::abstract_value<unsigned_int>::~abstract_value(abstract_value<unsigned_int> *this)

{
  abstract_value<unsigned_int> *this_local;
  
  (this->super_Value)._vptr_Value = (_func_int **)&PTR__abstract_value_002d9248;
  std::__cxx11::string::~string((string *)&this->m_implicit_value);
  std::__cxx11::string::~string((string *)&this->m_default_value);
  std::shared_ptr<unsigned_int>::~shared_ptr(&this->m_result);
  Value::~Value(&this->super_Value);
  return;
}

Assistant:

~abstract_value() override = default;